

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

void __thiscall DataStream::ignore(DataStream *this,size_t num_ignore)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  unsigned_long *puVar4;
  size_type sVar5;
  char *pcVar6;
  optional<unsigned_long> *poVar7;
  long in_RDI;
  long in_FS_OFFSET;
  optional<unsigned_long> next_read_pos;
  vector<std::byte,_zero_after_free_allocator<std::byte>_> *in_stack_ffffffffffffff78;
  io_errc in_stack_ffffffffffffff84;
  error_code *in_stack_ffffffffffffff88;
  optional<unsigned_long> *this_00;
  unsigned_long in_stack_ffffffffffffff90;
  char *pcVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckedAdd<unsigned_long>(in_stack_ffffffffffffff90,(unsigned_long)in_stack_ffffffffffffff88);
  bVar3 = std::optional<unsigned_long>::has_value
                    ((optional<unsigned_long> *)in_stack_ffffffffffffff78);
  if (bVar3) {
    puVar4 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_ffffffffffffff88);
    uVar2 = *puVar4;
    sVar5 = std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
                      (in_stack_ffffffffffffff78);
    if (uVar2 <= sVar5) {
      puVar4 = std::optional<unsigned_long>::value
                         ((optional<unsigned_long> *)in_stack_ffffffffffffff88);
      this_00 = (optional<unsigned_long> *)*puVar4;
      poVar7 = (optional<unsigned_long> *)
               std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::size
                         (in_stack_ffffffffffffff78);
      if (this_00 == poVar7) {
        *(undefined8 *)(in_RDI + 0x18) = 0;
        std::vector<std::byte,_zero_after_free_allocator<std::byte>_>::clear
                  (in_stack_ffffffffffffff78);
      }
      else {
        puVar4 = std::optional<unsigned_long>::value(this_00);
        *(unsigned_long *)(in_RDI + 0x18) = *puVar4;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      goto LAB_00320142;
    }
  }
  pcVar6 = (char *)__cxa_allocate_exception(0x20);
  pcVar8 = pcVar6;
  std::error_code::error_code<std::io_errc,void>
            (in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
  std::ios_base::failure[abi:cxx11]::failure
            (pcVar6,(error_code *)"DataStream::ignore(): end of data");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(pcVar8,&std::ios_base::failure[abi:cxx11]::typeinfo,
                std::ios_base::failure[abi:cxx11]::~failure);
  }
LAB_00320142:
  __stack_chk_fail();
}

Assistant:

void ignore(size_t num_ignore)
    {
        // Ignore from the beginning of the buffer
        auto next_read_pos{CheckedAdd(m_read_pos, num_ignore)};
        if (!next_read_pos.has_value() || next_read_pos.value() > vch.size()) {
            throw std::ios_base::failure("DataStream::ignore(): end of data");
        }
        if (next_read_pos.value() == vch.size()) {
            m_read_pos = 0;
            vch.clear();
            return;
        }
        m_read_pos = next_read_pos.value();
    }